

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  pointer pcVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ostream *poVar10;
  _Rb_tree_node_base *p_Var11;
  char *pcVar12;
  cmCTestBuildAndTestHandler *this_00;
  char *__s;
  long *plVar13;
  cmCTestGenericHandler *pcVar14;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 extraout_DL_05;
  undefined1 extraout_DL_06;
  undefined1 extraout_DL_07;
  undefined1 extraout_DL_08;
  undefined1 extraout_DL_09;
  undefined1 extraout_DL_10;
  undefined1 collapse;
  string *psVar15;
  bool SRArgumentSpecified;
  string errormsg;
  string arg;
  string targ;
  size_t local_238;
  bool local_22d;
  uint local_22c;
  string local_228;
  long *local_208;
  long local_1f8 [2];
  ulong local_1e8;
  undefined8 local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  string *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_22d = false;
  local_1b8 = output;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->InitialCommandLineArguments,
             (this->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_238 = 1;
  uVar9 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar9 < 0x21) {
    local_22c = (uint)CONCAT71((int7)(uVar9 >> 8),1);
    local_1e8 = 0;
    collapse = extraout_DL;
  }
  else {
    local_1b0 = &this->ScheduleType;
    local_1e0 = CONCAT71((int7)((ulong)local_1b0 >> 8),1);
    local_22c = (uint)local_1e0;
    local_1e8 = 0;
    do {
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      bVar6 = HandleCommandLineArguments(this,&local_238,args,&local_228);
      if (bVar6) {
        HandleScriptArguments(this,&local_238,args,&local_22d);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1d8[0] = local_1c8;
        pcVar3 = pbVar2[local_238]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar3,pcVar3 + pbVar2[local_238]._M_string_length);
        iVar7 = std::__cxx11::string::compare((char *)local_1d8);
        if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1d8), iVar7 == 0))
           && (pbVar2 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
              local_238 <
              ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
          this->ProduceXML = true;
          local_238 = local_238 + 1;
          local_1a8._0_8_ = local_1a8 + 0x10;
          pcVar3 = pbVar2[local_238]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar3,pcVar3 + pbVar2[local_238]._M_string_length);
          bVar6 = AddTestsForDashboardType(this,(string *)local_1a8);
          if ((!bVar6) && (bVar6 = AddVariableDefinition(this,(string *)local_1a8), !bVar6)) {
            ErrorMessageUnknownDashDValue(this,(string *)local_1a8);
            local_22c = 0;
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
        }
        iVar7 = std::__cxx11::string::compare((char *)local_1d8);
        if ((iVar7 != 0) &&
           (bVar6 = cmsys::SystemTools::StringStartsWith((char *)local_1d8[0],"-D"), bVar6)) {
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_1d8);
          AddVariableDefinition(this,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
        }
        iVar7 = std::__cxx11::string::compare((char *)local_1d8);
        if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1d8), iVar7 == 0))
           && (pbVar2 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
              local_238 <
              ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
          this->ProduceXML = true;
          local_238 = local_238 + 1;
          bVar6 = SetTest(this,pbVar2[local_238]._M_dataplus._M_p,false);
          if (!bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"CTest -T called with incorrect option: ",0x27);
            pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,pbVar2[local_238]._M_dataplus._M_p,
                                 pbVar2[local_238]._M_string_length);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Log(this,6,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                ,0x990,(char *)local_208,false);
            if (local_208 != local_1f8) {
              operator_delete(local_208,local_1f8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Available options are:",0x16);
            cVar5 = (char)(string *)local_1a8;
            std::ios::widen((char)*(undefined8 *)(local_1a8._0_8_ + -0x18) + cVar5);
            std::ostream::put(cVar5);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T all",7);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T start",9);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T update",10);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T configure",0xd);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T build",9);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T test",8);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T coverage",0xc);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T memcheck",0xc);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T notes",9);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            poVar10 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," -T submit",10);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Log(this,6,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                ,0x99b,(char *)local_208,false);
            if (local_208 != local_1f8) {
              operator_delete(local_208,local_1f8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            local_22c = 0;
          }
        }
        iVar7 = std::__cxx11::string::compare((char *)local_1d8);
        if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1d8), iVar7 == 0))
           && (pbVar2 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
              local_238 <
              ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
          local_238 = local_238 + 1;
          psVar15 = pbVar2 + local_238;
          cmsys::SystemTools::LowerCase((string *)local_1a8,psVar15);
          iVar7 = std::__cxx11::string::compare((char *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (iVar7 == 0) {
            this->InteractiveDebugMode = false;
            this->TestModel = 1;
          }
          else {
            cmsys::SystemTools::LowerCase((string *)local_1a8,psVar15);
            iVar7 = std::__cxx11::string::compare((char *)local_1a8);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (iVar7 == 0) {
              this->InteractiveDebugMode = false;
              this->TestModel = 2;
            }
            else {
              cmsys::SystemTools::LowerCase((string *)local_1a8,psVar15);
              iVar7 = std::__cxx11::string::compare((char *)local_1a8);
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
              if (iVar7 == 0) {
                this->InteractiveDebugMode = false;
                this->TestModel = 0;
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"CTest -M called with incorrect option: ",0x27);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(psVar15->_M_dataplus)._M_p,
                                     psVar15->_M_string_length);
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                std::__cxx11::stringbuf::str();
                Log(this,6,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                    ,0x9b6,(char *)local_208,false);
                if (local_208 != local_1f8) {
                  operator_delete(local_208,local_1f8[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Available options are:",0x16);
                cVar5 = (char)(ostringstream *)local_1a8;
                std::ios::widen((char)*(undefined8 *)(local_1a8._0_8_ + -0x18) + cVar5);
                std::ostream::put(cVar5);
                poVar10 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," -M Continuous",0xe);
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                poVar10 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," -M Experimental",0x10);
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                poVar10 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ctest",5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," -M Nightly",0xb);
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                std::__cxx11::stringbuf::str();
                Log(this,6,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                    ,0x9ba,(char *)local_208,false);
                if (local_208 != local_1f8) {
                  operator_delete(local_208,local_1f8[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                local_22c = 0;
              }
            }
          }
        }
        iVar7 = std::__cxx11::string::compare((char *)local_1d8);
        if ((iVar7 == 0) &&
           (local_238 <
            ((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          this->ProduceXML = true;
          SetTest(this,"Submit",true);
          local_238 = local_238 + 1;
          bVar6 = SubmitExtraFiles(this,(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[local_238].
                                        _M_dataplus._M_p);
          collapse = extraout_DL_01;
          if (bVar6) goto LAB_00261019;
LAB_00261153:
          bVar6 = false;
          local_1e0 = 0;
        }
        else {
LAB_00261019:
          iVar7 = std::__cxx11::string::compare((char *)local_1d8);
          if (iVar7 == 0) {
            local_1e8 = CONCAT71((int7)(local_1e8 >> 8),
                                 (byte)local_1e8 |
                                 local_238 <
                                 ((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
          }
          iVar7 = std::__cxx11::string::compare((char *)local_1d8);
          collapse = extraout_DL_02;
          if (iVar7 == 0) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_1b0,0,(char *)(this->ScheduleType)._M_string_length,0x59c9a4);
            collapse = extraout_DL_03;
          }
          bVar6 = true;
          p_Var11 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while ((_Rb_tree_header *)p_Var11 !=
                 &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header) {
            iVar7 = (**(code **)(**(long **)(p_Var11 + 2) + 0x30))
                              (*(long **)(p_Var11 + 2),(string *)local_1d8,&local_238,args);
            if (iVar7 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Problem parsing command line arguments within a handler",0x37);
              std::__cxx11::stringbuf::str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                  ,0x9df,(char *)local_208,false);
              if (local_208 != local_1f8) {
                operator_delete(local_208,local_1f8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              collapse = extraout_DL_05;
              goto LAB_00261153;
            }
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
            collapse = extraout_DL_04;
          }
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
          collapse = extraout_DL_06;
        }
      }
      else {
        bVar6 = false;
        cmSystemTools::Error(local_228._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        local_1e0 = 1;
        collapse = extraout_DL_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
        collapse = extraout_DL_07;
      }
      if (!bVar6) {
        return (int)local_1e0;
      }
      local_238 = local_238 + 1;
    } while (local_238 <
             (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if ((this->ParallelLevelSetInCli == false) &&
     (pcVar12 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL"), collapse = extraout_DL_08,
     pcVar12 != (char *)0x0)) {
    iVar8 = atoi(pcVar12);
    iVar7 = 1;
    if (1 < iVar8) {
      iVar7 = iVar8;
    }
    this->ParallelLevel = iVar7;
    collapse = extraout_DL_09;
  }
  if ((local_1e8 & 1) != 0) {
    this->Verbose = true;
    this_00 = (cmCTestBuildAndTestHandler *)GetHandler(this,"buildtest");
    iVar7 = (*(this_00->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject[5])(this_00);
    __s = cmCTestBuildAndTestHandler::GetOutput(this_00);
    psVar15 = local_1b8;
    pcVar12 = (char *)local_1b8->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar12,(ulong)__s);
    cmDynamicLoader::FlushCache();
    if (iVar7 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"build and test failing returning: ",0x22);
      plVar13 = (long *)std::ostream::operator<<(local_1a8,iVar7);
      std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
      std::ostream::put((char)plVar13);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x9fd,local_228._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return iVar7;
    }
    return 0;
  }
  if ((local_22c & 1) == 0) {
    return 1;
  }
  if (this->RunConfigurationScript == true) {
    if (this->ExtraVerbose == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"* Extra verbosity turned on",0x1b);
      std::ios::widen((char)(ostringstream *)local_1a8 +
                      (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0xa0a,local_228._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    p_Var11 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      bVar6 = this->ExtraVerbose;
      iVar7 = this->SubmitIndex;
      do {
        lVar4 = *(long *)(p_Var11 + 2);
        *(uint *)(lVar4 + 0x18) = (uint)bVar6;
        *(int *)(lVar4 + 0x90) = iVar7;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    }
    pcVar14 = GetHandler(this,"script");
    pcVar14->HandlerVerbose = (uint)this->Verbose;
    pcVar14 = GetHandler(this,"script");
    iVar7 = (*(pcVar14->super_cmObject)._vptr_cmObject[5])(pcVar14);
    if (iVar7 == 0) {
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"running script failing returning: ",0x22);
    plVar13 = (long *)std::ostream::operator<<(local_1a8,iVar7);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
    std::ostream::put((char)plVar13);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0xa19,local_228._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                               local_228.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    this->ExtraVerbose = this->Verbose;
    this->Verbose = true;
    p_Var11 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      iVar7 = this->SubmitIndex;
      do {
        lVar4 = *(long *)(p_Var11 + 2);
        *(undefined4 *)(lVar4 + 0x18) = 1;
        *(int *)(lVar4 + 0x90) = iVar7;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        collapse = extraout_DL_10;
      } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_228,(SystemTools *)0x1,(bool)collapse);
    iVar7 = Initialize(this,local_228._M_dataplus._M_p,(cmCTestStartCommand *)0x0);
    if (iVar7 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Problem initializing the dashboard.",0x23);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0xa30,(char *)local_1d8[0],false);
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      iVar7 = 0xc;
    }
    else {
      iVar7 = ProcessTests(this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                               local_228.field_2._M_local_buf[0]) + 1);
    }
    if (iVar7 == 0) {
      return 0;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Running a test(s) failed returning : ",0x25);
  plVar13 = (long *)std::ostream::operator<<(local_1a8,iVar7);
  std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
  std::ostream::put((char)plVar13);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0xa3b,local_228._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return iVar7;
}

Assistant:

int cmCTest::Run(std::vector<std::string> &args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  this->InitialCommandLineArguments.insert(
      this->InitialCommandLineArguments.end(),
      args.begin(), args.end());

  // process the command line arguments
  for(size_t i=1; i < args.size(); ++i)
    {
    // handle the simple commandline arguments
    std::string errormsg;
    if(!this->HandleCommandLineArguments(i,args, errormsg))
      {
      cmSystemTools::Error(errormsg.c_str());
      return 1;
      }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i,args,SRArgumentSpecified);

    // handle a request for a dashboard
    std::string arg = args[i];
    if(this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1 )
      {
      this->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ))
        {
        if (!this->AddVariableDefinition(targ))
          {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
          }
        }
      }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if(arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D"))
      {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
      }

    if(this->CheckArgument(arg, "-T", "--test-action") &&
      (i < args.size() -1) )
      {
      this->ProduceXML = true;
      i++;
      if ( !this->SetTest(args[i].c_str(), false) )
        {
        executeTests = false;
        cmCTestLog(this, ERROR_MESSAGE,
          "CTest -T called with incorrect option: "
          << args[i] << std::endl);
        cmCTestLog(this, ERROR_MESSAGE, "Available options are:" << std::endl
          << "  " << ctestExec << " -T all" << std::endl
          << "  " << ctestExec << " -T start" << std::endl
          << "  " << ctestExec << " -T update" << std::endl
          << "  " << ctestExec << " -T configure" << std::endl
          << "  " << ctestExec << " -T build" << std::endl
          << "  " << ctestExec << " -T test" << std::endl
          << "  " << ctestExec << " -T coverage" << std::endl
          << "  " << ctestExec << " -T memcheck" << std::endl
          << "  " << ctestExec << " -T notes" << std::endl
          << "  " << ctestExec << " -T submit" << std::endl);
        }
      }

    // what type of test model
    if(this->CheckArgument(arg, "-M", "--test-model") &&
      (i < args.size() -1) )
      {
      i++;
      std::string const& str = args[i];
      if ( cmSystemTools::LowerCase(str) == "nightly" )
        {
        this->SetTestModel(cmCTest::NIGHTLY);
        }
      else if ( cmSystemTools::LowerCase(str) == "continuous" )
        {
        this->SetTestModel(cmCTest::CONTINUOUS);
        }
      else if ( cmSystemTools::LowerCase(str) == "experimental" )
        {
        this->SetTestModel(cmCTest::EXPERIMENTAL);
        }
      else
        {
        executeTests = false;
        cmCTestLog(this, ERROR_MESSAGE,
          "CTest -M called with incorrect option: " << str
          << std::endl);
        cmCTestLog(this, ERROR_MESSAGE, "Available options are:" << std::endl
          << "  " << ctestExec << " -M Continuous" << std::endl
          << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
        }
      }

    if(this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1)
      {
      this->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if ( !this->SubmitExtraFiles(args[i].c_str()) )
        {
        return 0;
        }
      }

    // --build-and-test options
    if(this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1)
      {
      cmakeAndTest = true;
      }

    if(this->CheckArgument(arg, "--schedule-random"))
      {
      this->ScheduleType = "Random";
      }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    cmCTest::t_TestingHandlers::iterator it;
    for ( it = this->TestingHandlers.begin();
      it != this->TestingHandlers.end();
      ++ it )
      {
      if ( !it->second->ProcessCommandLineArguments(arg, i, args) )
        {
        cmCTestLog(this, ERROR_MESSAGE,
          "Problem parsing command line arguments within a handler");
        return 0;
        }
      }
    } // the close of the for argument loop

  if (!this->ParallelLevelSetInCli)
    {
    if (const char *parallel = cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL"))
      {
      int plevel = atoi(parallel);
      this->SetParallelLevel(plevel);
      }
    }

  // now what sould cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if(cmakeAndTest)
    {
    this->Verbose = true;
    cmCTestBuildAndTestHandler* handler =
      static_cast<cmCTestBuildAndTestHandler*>(this->GetHandler("buildtest"));
    int retv = handler->ProcessHandler();
    *output = handler->GetOutput();
#ifdef CMAKE_BUILD_WITH_CMAKE
    cmDynamicLoader::FlushCache();
#endif
    if(retv != 0)
      {
      cmCTestLog(this, DEBUG, "build and test failing returning: " << retv
                 << std::endl);
      }
    return retv;
    }

  if(executeTests)
    {
    int res;
    // call process directory
    if (this->RunConfigurationScript)
      {
      if ( this->ExtraVerbose )
        {
        cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
        }
      cmCTest::t_TestingHandlers::iterator it;
      for ( it = this->TestingHandlers.begin();
        it != this->TestingHandlers.end();
        ++ it )
        {
        it->second->SetVerbose(this->ExtraVerbose);
        it->second->SetSubmitIndex(this->SubmitIndex);
        }
      this->GetHandler("script")->SetVerbose(this->Verbose);
      res = this->GetHandler("script")->ProcessHandler();
      if(res != 0)
        {
        cmCTestLog(this, DEBUG, "running script failing returning: " << res
                   << std::endl);
        }

      }
    else
      {
      // What is this?  -V seems to be the same as -VV,
      // and Verbose is always on in this case
      this->ExtraVerbose = this->Verbose;
      this->Verbose = true;
      cmCTest::t_TestingHandlers::iterator it;
      for ( it = this->TestingHandlers.begin();
        it != this->TestingHandlers.end();
        ++ it )
        {
        it->second->SetVerbose(this->Verbose);
        it->second->SetSubmitIndex(this->SubmitIndex);
        }
      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      if(!this->Initialize(cwd.c_str(), 0))
        {
        res = 12;
        cmCTestLog(this, ERROR_MESSAGE, "Problem initializing the dashboard."
          << std::endl);
        }
      else
        {
        res = this->ProcessTests();
        }
      this->Finalize();
      }
    if(res != 0)
      {
      cmCTestLog(this, DEBUG, "Running a test(s) failed returning : " << res
                 << std::endl);
      }
    return res;
    }

  return 1;
}